

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall
ON_PolyCurve::Split(ON_PolyCurve *this,double split_parameter,ON_Curve **left_side,
                   ON_Curve **right_side)

{
  ON_PolyCurve *pOVar1;
  ON_Curve *pOVar2;
  ON_Curve **__s;
  ON_Curve **ppOVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  double *pdVar7;
  ON_PolyCurve *this_00;
  ON_PolyCurve *this_01;
  long lVar8;
  ON_Curve **ppOVar9;
  uint uVar10;
  size_t sVar11;
  ON_PolyCurve *this_ptr;
  long lVar12;
  long lVar13;
  double dVar14;
  int si;
  ON_SimpleArray<ON_Curve_*> right_segment;
  ON_Interval c_dom;
  ON_SimpleArray<ON_Curve_*> left_segment;
  ON_SimpleArray<double> left_t;
  ON_Curve *seg_left;
  ON_SimpleArray<double> right_t;
  ON_Interval s_dom;
  ON_Interval dom;
  uint local_10c;
  double local_108;
  double local_100;
  ON_Curve *local_f8;
  double local_f0;
  double **local_e8;
  ON_SimpleArray<ON_Curve_*> local_e0;
  ON_Interval local_c8;
  ON_SimpleArray<ON_Curve_*> local_b8;
  ON_SimpleArray<double> local_a0;
  ON_Curve *local_88;
  ON_Curve *local_80;
  ON_SimpleArray<double> local_78;
  ON_Curve **local_60;
  ON_Curve **local_58;
  ON_Interval local_50;
  ON_Interval local_40;
  
  local_100 = split_parameter;
  local_f0 = split_parameter;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  pOVar1 = (ON_PolyCurve *)*left_side;
  if (pOVar1 == (ON_PolyCurve *)0x0) {
    this_00 = (ON_PolyCurve *)0x0;
  }
  else {
    bVar4 = ON_Object::IsKindOf((ON_Object *)pOVar1,&m_ON_PolyCurve_class_rtti);
    this_00 = (ON_PolyCurve *)0x0;
    if (bVar4) {
      this_00 = pOVar1;
    }
  }
  pOVar1 = (ON_PolyCurve *)*right_side;
  if (pOVar1 == (ON_PolyCurve *)0x0) {
    this_01 = (ON_PolyCurve *)0x0;
  }
  else {
    bVar4 = ON_Object::IsKindOf((ON_Object *)pOVar1,&m_ON_PolyCurve_class_rtti);
    this_01 = (ON_PolyCurve *)0x0;
    if (bVar4) {
      this_01 = pOVar1;
    }
  }
  if (this_00 == this || this_00 == (ON_PolyCurve *)0x0) {
    if (this_00 == this) {
      ON_Curve::DestroyCurveTree(&this_00->super_ON_Curve);
    }
  }
  else {
    ON_CurveArray::Destroy(&this_00->m_segment);
    ON_SimpleArray<double>::SetCapacity(&this_00->m_t,0);
  }
  if (this_01 == this || this_01 == (ON_PolyCurve *)0x0) {
    if (this_01 == this) {
      ON_Curve::DestroyCurveTree(&this_01->super_ON_Curve);
    }
  }
  else {
    ON_CurveArray::Destroy(&this_01->m_segment);
    ON_SimpleArray<double>::SetCapacity(&this_01->m_t,0);
  }
  if ((((this_00 == (ON_PolyCurve *)0x0) && (*left_side != (ON_Curve *)0x0)) ||
      ((this_01 == (ON_PolyCurve *)0x0 && (*right_side != (ON_Curve *)0x0)))) ||
     (bVar4 = ON_Interval::Includes(&local_40,local_100,true), !bVar4)) {
    return false;
  }
  local_e8 = (double **)CONCAT71(local_e8._1_7_,this_01 != this);
  local_100 = (double)CONCAT71(local_100._1_7_,this_00 != this);
  local_60 = left_side;
  local_58 = right_side;
  bVar4 = ON_Curve::ParameterSearch
                    (&this->super_ON_Curve,local_f0,(int *)&local_10c,true,&this->m_t,
                     1.490116119385e-08);
  if (bVar4) {
    if ((int)local_10c < 1) {
      return false;
    }
    if ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count <= (int)local_10c) {
      return false;
    }
  }
  local_50 = SegmentDomain(this,local_10c);
  local_c8.m_t[1] = local_50.m_t[1];
  if ((long)(int)local_10c < 0) {
    return false;
  }
  if ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count <= (int)local_10c) {
    return false;
  }
  pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[(int)local_10c];
  if (pOVar2 == (ON_Curve *)0x0) {
    return false;
  }
  (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar2);
  if (bVar4) {
    pdVar7 = ON_Interval::operator[](&local_c8,0);
    local_108 = *pdVar7;
    local_80 = (ON_Curve *)0x0;
    local_88 = (ON_Curve *)0x0;
LAB_0058bf84:
    dVar14 = ON_Interval::ParameterAt(&local_c8,0.5);
    uVar10 = (uint)(dVar14 < local_108);
LAB_0058bfa2:
    pdVar7 = ON_Interval::operator[](&local_c8,uVar10);
    local_108 = *pdVar7;
  }
  else {
    local_108 = ON_Interval::TransformParameterTo(&local_50,&local_c8,local_f0);
    local_80 = (ON_Curve *)0x0;
    local_88 = (ON_Curve *)0x0;
    bVar4 = ON_Interval::Includes(&local_c8,local_108,true);
    if (!bVar4) goto LAB_0058bf84;
    iVar5 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3e])
                      (local_108,pOVar2,&local_80,&local_88);
    if ((char)iVar5 == '\0') {
      dVar14 = ON_Interval::NormalizedParameterAt(&local_c8,local_108);
      uVar10 = 0;
      if (0.001 < dVar14) {
        dVar14 = ON_Interval::NormalizedParameterAt(&local_c8,local_108);
        uVar10 = 1;
        if (dVar14 < 0.999) {
          return false;
        }
      }
      goto LAB_0058bfa2;
    }
  }
  local_100 = (double)CONCAT71(local_100._1_7_,local_100._0_1_ & (byte)local_e8);
  local_b8._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080bda0;
  local_b8.m_a = (ON_Curve **)0x0;
  local_b8.m_count = 0;
  local_b8.m_capacity = 0;
  local_e0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080bda0;
  local_e0.m_a = (ON_Curve **)0x0;
  local_e0.m_count = 0;
  local_e0.m_capacity = 0;
  local_a0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a228;
  local_a0.m_a = (double *)0x0;
  local_a0.m_count = 0;
  local_a0.m_capacity = 0;
  local_78._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a228;
  local_78.m_a = (double *)0x0;
  local_78.m_count = 0;
  local_78.m_capacity = 0;
  if ((local_80 == (ON_Curve *)0x0) || (local_88 == (ON_Curve *)0x0)) {
    pdVar7 = ON_Interval::operator[](&local_c8,1);
    if ((local_108 == *pdVar7) && (!NAN(local_108) && !NAN(*pdVar7))) {
      local_10c = local_10c + 1;
    }
    pdVar7 = ON_Interval::operator[](&local_c8,0);
    if (((local_108 != *pdVar7) || (NAN(local_108) || NAN(*pdVar7))) || (local_10c != 0)) {
      pdVar7 = ON_Interval::operator[](&local_c8,1);
      if (((local_108 != *pdVar7) || (NAN(local_108) || NAN(*pdVar7))) ||
         (local_10c != (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count)) {
        if ((uint)local_b8.m_capacity < local_10c) {
          ON_SimpleArray<ON_Curve_*>::SetCapacity(&local_b8,(long)(int)local_10c);
        }
        sVar11 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count -
                 (long)(int)local_10c;
        if ((uint)local_e0.m_capacity < (uint)sVar11) {
          ON_SimpleArray<ON_Curve_*>::SetCapacity(&local_e0,sVar11);
        }
        if ((uint)local_a0.m_capacity < (uint)((long)local_b8.m_count + 1U)) {
          ON_SimpleArray<double>::SetCapacity(&local_a0,(long)local_b8.m_count + 1U);
        }
        if ((uint)local_78.m_capacity < (uint)((long)local_e0.m_count + 1U)) {
          ON_SimpleArray<double>::SetCapacity(&local_78,(long)local_e0.m_count + 1U);
        }
        if (0 < (int)local_10c) {
          lVar8 = 0;
          lVar12 = 0;
          do {
            if (local_100._0_1_ == '\0') {
              ON_SimpleArray<ON_Curve_*>::Append
                        (&local_b8,
                         (ON_Curve **)
                         ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a + lVar8));
            }
            else {
              local_f8 = ON_Curve::Duplicate(*(ON_Curve **)
                                              ((long)(this->m_segment).
                                                     super_ON_SimpleArray<ON_Curve_*>.m_a + lVar8));
              ON_SimpleArray<ON_Curve_*>::Append(&local_b8,&local_f8);
            }
            ON_SimpleArray<double>::Append(&local_a0,(double *)((long)(this->m_t).m_a + lVar8));
            lVar12 = lVar12 + 1;
            lVar8 = lVar8 + 8;
          } while (lVar12 < (int)local_10c);
        }
        ON_SimpleArray<double>::Append(&local_a0,&local_f0);
        lVar8 = (long)(int)local_10c;
        iVar5 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
        lVar12 = (long)iVar5;
        if ((int)local_10c < iVar5) {
          lVar13 = lVar8 * 8;
          do {
            if (local_100._0_1_ == '\0') {
              ON_SimpleArray<ON_Curve_*>::Append
                        (&local_e0,
                         (ON_Curve **)
                         ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a + lVar13));
            }
            else {
              local_f8 = ON_Curve::Duplicate(*(ON_Curve **)
                                              ((long)(this->m_segment).
                                                     super_ON_SimpleArray<ON_Curve_*>.m_a + lVar13))
              ;
              ON_SimpleArray<ON_Curve_*>::Append(&local_e0,&local_f8);
            }
            pdVar7 = (double *)((long)(this->m_t).m_a + lVar13);
            if ((uint)lVar8 == local_10c) {
              pdVar7 = &local_f0;
            }
            ON_SimpleArray<double>::Append(&local_78,pdVar7);
            lVar8 = lVar8 + 1;
            lVar12 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
            lVar13 = lVar13 + 8;
          } while (lVar8 < lVar12);
        }
        local_e8 = &(this->m_t).m_a;
        goto LAB_0058c40c;
      }
    }
    bVar4 = false;
  }
  else {
    if (local_10c + 1 == 0) {
      uVar10 = 0xffffffff;
      uVar6 = 0;
    }
    else {
      ON_SimpleArray<ON_Curve_*>::SetCapacity(&local_b8,(long)(int)(local_10c + 1));
      uVar10 = local_10c;
      uVar6 = local_e0.m_capacity;
    }
    sVar11 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count - (long)(int)uVar10;
    if (uVar6 < (uint)sVar11) {
      ON_SimpleArray<ON_Curve_*>::SetCapacity(&local_e0,sVar11);
    }
    if ((uint)local_a0.m_capacity < (uint)((long)local_b8.m_count + 1U)) {
      ON_SimpleArray<double>::SetCapacity(&local_a0,(long)local_b8.m_count + 1U);
    }
    if ((uint)local_78.m_capacity < (uint)((long)local_e0.m_count + 1U)) {
      ON_SimpleArray<double>::SetCapacity(&local_78,(long)local_e0.m_count + 1U);
    }
    if (local_100._0_1_ == '\0') {
      lVar8 = (long)(int)local_10c;
      ppOVar9 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
      if (ppOVar9[lVar8] != (ON_Curve *)0x0) {
        (*(ppOVar9[lVar8]->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
        ppOVar9 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
        lVar8 = (long)(int)local_10c;
      }
      ppOVar9[lVar8] = (ON_Curve *)0x0;
    }
    if (0 < (int)local_10c) {
      lVar8 = 0;
      lVar12 = 0;
      do {
        if (local_100._0_1_ == '\0') {
          ON_SimpleArray<ON_Curve_*>::Append
                    (&local_b8,
                     (ON_Curve **)
                     ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a + lVar8));
        }
        else {
          local_f8 = ON_Curve::Duplicate(*(ON_Curve **)
                                          ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.
                                                 m_a + lVar8));
          ON_SimpleArray<ON_Curve_*>::Append(&local_b8,&local_f8);
        }
        ON_SimpleArray<double>::Append(&local_a0,(double *)((long)(this->m_t).m_a + lVar8));
        lVar12 = lVar12 + 1;
        lVar8 = lVar8 + 8;
      } while (lVar12 < (int)local_10c);
    }
    ON_SimpleArray<ON_Curve_*>::Append(&local_b8,&local_80);
    ON_SimpleArray<double>::Append(&local_a0,(this->m_t).m_a + (int)local_10c);
    ON_SimpleArray<double>::Append(&local_a0,&local_f0);
    ON_SimpleArray<ON_Curve_*>::Append(&local_e0,&local_88);
    ON_SimpleArray<double>::Append(&local_78,&local_f0);
    local_e8 = &(this->m_t).m_a;
    lVar13 = (long)(int)local_10c;
    lVar8 = lVar13 * 8;
    while( true ) {
      lVar8 = lVar8 + 8;
      lVar13 = lVar13 + 1;
      lVar12 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
      if (lVar12 <= lVar13) break;
      if (local_100._0_1_ == '\0') {
        ON_SimpleArray<ON_Curve_*>::Append
                  (&local_e0,
                   (ON_Curve **)
                   ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a + lVar8));
      }
      else {
        local_f8 = ON_Curve::Duplicate(*(ON_Curve **)
                                        ((long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.
                                               m_a + lVar8));
        ON_SimpleArray<ON_Curve_*>::Append(&local_e0,&local_f8);
      }
      ON_SimpleArray<double>::Append(&local_78,(double *)(lVar8 + (long)*local_e8));
    }
LAB_0058c40c:
    ON_SimpleArray<double>::Append(&local_78,*local_e8 + lVar12);
    ppOVar3 = local_58;
    ppOVar9 = local_60;
    if (this_00 == (ON_PolyCurve *)0x0) {
      this_00 = (ON_PolyCurve *)operator_new(0x40);
      ON_PolyCurve(this_00);
    }
    if (this_01 == (ON_PolyCurve *)0x0) {
      this_01 = (ON_PolyCurve *)operator_new(0x40);
      ON_PolyCurve(this_01);
    }
    if (local_100._0_1_ == '\0') {
      __s = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
      if ((__s != (ON_Curve **)0x0) &&
         (lVar8 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_capacity, 0 < lVar8)) {
        memset(__s,0,lVar8 << 3);
      }
      pdVar7 = (this->m_t).m_a;
      if ((pdVar7 != (double *)0x0) && (lVar8 = (long)(this->m_t).m_capacity, 0 < lVar8)) {
        memset(pdVar7,0,lVar8 << 3);
      }
      if (-1 < (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_capacity) {
        (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count = 0;
      }
      if (-1 < (this->m_t).m_capacity) {
        (this->m_t).m_count = 0;
      }
    }
    ON_SimpleArray<ON_Curve_*>::Append
              (&(this_00->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_b8.m_count,local_b8.m_a)
    ;
    ON_SimpleArray<double>::Append(&this_00->m_t,local_a0.m_count,local_a0.m_a);
    ON_SimpleArray<ON_Curve_*>::Append
              (&(this_01->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_e0.m_count,local_e0.m_a)
    ;
    ON_SimpleArray<double>::Append(&this_01->m_t,local_78.m_count,local_78.m_a);
    *ppOVar9 = &this_00->super_ON_Curve;
    *ppOVar3 = &this_01->super_ON_Curve;
    bVar4 = true;
  }
  ON_SimpleArray<double>::~ON_SimpleArray(&local_78);
  ON_SimpleArray<double>::~ON_SimpleArray(&local_a0);
  ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&local_e0);
  ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&local_b8);
  return bVar4;
}

Assistant:

bool ON_PolyCurve::Split(
    double split_parameter,
    ON_Curve*& left_side, // left portion returned here
    ON_Curve*& right_side // right portion returned here
  ) const
{
  int si;
  ON_Interval dom = Domain();
  
  ON_PolyCurve* pLeftSide  = ON_PolyCurve::Cast(left_side);
  ON_PolyCurve* pRightSide = ON_PolyCurve::Cast(right_side);

  if ( pLeftSide && pLeftSide != this )
    pLeftSide->Destroy();
  else if ( pLeftSide == this )
    pLeftSide->DestroyCurveTree();

  if ( pRightSide && pRightSide != this )
    pRightSide->Destroy();
  else if ( pRightSide == this )
    pRightSide->DestroyCurveTree();

  if ( left_side && !pLeftSide )
    return false;
  if ( right_side && !pRightSide )
    return false;
  if ( !dom.Includes( split_parameter, true ) )
    return false; // split_parameter is not an interior parameter


  const bool bDupSegs = ( this != pLeftSide && this != pRightSide );

		/* 4 April 2003 Greg Arden		Made the following changes:
																		1.	Use ParameterSearch() to decide if we should snap domain
																				boundaries to m_t array values.
																		2.  Make sure resulting polycurves have Domain() specified as 
																				split parameter.   
																		3.  When true is returned the result passes IsValid().
		*/
	bool split_at_break = ParameterSearch(split_parameter, si, true);
	if( split_at_break && (si<=0 || si>=Count() ) )
		return false;

	ON_Interval s_dom = SegmentDomain(si);
  ON_Curve* seg_curve = SegmentCurve(si);
  if ( !seg_curve )
    return false;
  ON_Interval c_dom = seg_curve->Domain();

  double c;
  if (split_at_break)
    c = c_dom[0];
  else
    c = s_dom.TransformParameterTo(c_dom, split_parameter);

  ON_Curve* seg_left = 0;
  ON_Curve* seg_right = 0;

  if ( !split_at_break  && c_dom.Includes(c,true) )
  {
    if ( !seg_curve->Split( c, seg_left, seg_right ) )
    {
      double fuzz = 0.001; // anything small and > 1.0e-6 will work about the same.
      if ( c_dom.NormalizedParameterAt(c) <= fuzz )
        c = c_dom[0];
      else if ( c_dom.NormalizedParameterAt(c) >= 1.0 - fuzz )
        c = c_dom[1];
      else
        return false; // unable to split this segment
    }
  }
  else if ( c <= c_dom.ParameterAt(0.5) )
    c = c_dom[0];
  else
    c = c_dom[1];

  // use scratch arrays since this may also be pLeftSide or pRightSide
  ON_SimpleArray< ON_Curve* > left_segment;
  ON_SimpleArray< ON_Curve* > right_segment;
  ON_SimpleArray< double > left_t;
  ON_SimpleArray< double > right_t;

  int i;

  if ( seg_left && seg_right )
  {
    // we split a segment
    left_segment.Reserve(si+1);
    right_segment.Reserve(m_segment.Count()-si);
    left_t.Reserve(left_segment.Count()+1);
    right_t.Reserve(right_segment.Count()+1);
    if ( !bDupSegs )
    {
      delete m_segment[si];
      const_cast<ON_PolyCurve*>(this)->m_segment[si] = 0;
    }
    
    for ( i = 0; i < si; i++ )
    {
      if ( bDupSegs )
        left_segment.Append( m_segment[i]->Duplicate() );
      else
        left_segment.Append( m_segment[i] );
      left_t.Append( m_t[i] );
    }
    left_segment.Append( seg_left );
    left_t.Append( m_t[si] );
    left_t.Append( split_parameter );

    right_segment.Append(seg_right);
    right_t.Append( split_parameter );
    for ( i = si+1; i < m_segment.Count(); i++ )
    {
      if ( bDupSegs )
        right_segment.Append( m_segment[i]->Duplicate() );
      else
        right_segment.Append( m_segment[i] );
      right_t.Append( m_t[i] );
    }
    right_t.Append( m_t[m_segment.Count()] );
  }
  else 
  {
    if ( c == c_dom[1] )
      si++;
		if( (c==c_dom[0] && si==0 ) ||								// attempting split at curve start
				(c==c_dom[1] && si==m_segment.Count() ) )	// attempting split at curve end
			return false;

    left_segment.Reserve(si);
    right_segment.Reserve(m_segment.Count()-si);
    left_t.Reserve(left_segment.Count()+1);
    right_t.Reserve(right_segment.Count()+1);
    
    for ( i = 0; i < si; i++ )
    {
      if ( bDupSegs )
        left_segment.Append( m_segment[i]->Duplicate() );
      else
        left_segment.Append( m_segment[i] );
      left_t.Append( m_t[i] );
    }
    left_t.Append( split_parameter );

    for ( i = si; i < m_segment.Count(); i++ )
    {
      if ( bDupSegs )
        right_segment.Append( m_segment[i]->Duplicate() );
      else
        right_segment.Append( m_segment[i] );
      if ( i == si )
        right_t.Append( split_parameter );
      else
        right_t.Append( m_t[i] );
    }
    right_t.Append( m_t[m_segment.Count()] );
  }

  if ( !pLeftSide )
    pLeftSide = new ON_PolyCurve();
  if ( !pRightSide )
    pRightSide = new ON_PolyCurve();
  if ( !bDupSegs )
  {
    // pLeftSide or pRightSide is the same as this
    ON_PolyCurve* this_ptr = const_cast<ON_PolyCurve*>(this);
    this_ptr->m_segment.Zero();
    this_ptr->m_t.Zero();
    this_ptr->m_segment.SetCount(0);
    this_ptr->m_t.SetCount(0);
  }

  pLeftSide->m_segment.Append( left_segment.Count(), left_segment.Array() );
  pLeftSide->m_t.Append( left_t.Count(), left_t.Array() );
  pRightSide->m_segment.Append( right_segment.Count(), right_segment.Array() );
  pRightSide->m_t.Append( right_t.Count(), right_t.Array() );

  left_side = pLeftSide;
  right_side = pRightSide;

  return true;
}